

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O2

void __thiscall wasm::WasmSplitOptions::WasmSplitOptions(WasmSplitOptions *this)

{
  _Rb_tree_header *p_Var1;
  initializer_list<wasm::WasmSplitOptions::Mode> __l;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_00;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_01;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_02;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_03;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_04;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_05;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_06;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_07;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_08;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_09;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_10;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_11;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_12;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_13;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_14;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_15;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_16;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_17;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_18;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_19;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_20;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_21;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_22;
  Mode local_1320 [6];
  _Any_data local_1308;
  code *local_12f8;
  code *local_12f0;
  _Any_data local_12e8;
  code *local_12d8;
  code *local_12d0;
  _Any_data local_12c8;
  code *local_12b8;
  code *local_12b0;
  _Any_data local_12a8;
  code *local_1298;
  code *local_1290;
  _Any_data local_1288;
  code *local_1278;
  code *local_1270;
  _Any_data local_1268;
  code *local_1258;
  code *local_1250;
  _Any_data local_1248;
  code *local_1238;
  code *local_1230;
  _Any_data local_1228;
  code *local_1218;
  code *local_1210;
  _Any_data local_1208;
  code *local_11f8;
  code *local_11f0;
  _Any_data local_11e8;
  code *local_11d8;
  code *local_11d0;
  _Any_data local_11c8;
  code *local_11b8;
  code *local_11b0;
  _Any_data local_11a8;
  code *local_1198;
  code *local_1190;
  _Any_data local_1188;
  code *local_1178;
  code *local_1170;
  _Any_data local_1168;
  code *local_1158;
  code *local_1150;
  _Any_data local_1148;
  code *local_1138;
  code *local_1130;
  _Any_data local_1128;
  code *local_1118;
  code *local_1110;
  _Any_data local_1108;
  code *local_10f8;
  code *local_10f0;
  _Any_data local_10e8;
  code *local_10d8;
  code *local_10d0;
  _Any_data local_10c8;
  code *local_10b8;
  code *local_10b0;
  _Any_data local_10a8;
  code *local_1098;
  code *local_1090;
  _Any_data local_1088;
  code *local_1078;
  code *local_1070;
  _Any_data local_1068;
  code *local_1058;
  code *local_1050;
  _Any_data local_1048;
  code *local_1038;
  code *local_1030;
  _Any_data local_1028;
  code *local_1018;
  code *local_1010;
  _Any_data local_1008;
  code *local_ff8;
  code *local_ff0;
  _Any_data local_fe8;
  code *local_fd8;
  code *local_fd0;
  _Any_data local_fc8;
  code *local_fb8;
  code *local_fb0;
  _Any_data local_fa8;
  code *local_f98;
  code *local_f90;
  _Any_data local_f88;
  code *local_f78;
  code *local_f70;
  _Any_data local_f68;
  code *local_f58;
  code *local_f50;
  _Any_data local_f48;
  code *local_f38;
  code *local_f30;
  Mode local_f28 [8];
  string local_f08;
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string local_e48;
  string local_e28;
  string local_e08;
  string local_de8;
  string local_dc8;
  string local_da8;
  string local_d88;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428 [32];
  string local_408;
  string local_3e8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_3c8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_3b0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_398;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_380;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_368;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_350;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_338;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_320;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_308;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2f0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2d8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2c0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2a8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_290;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_278;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_260;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_248;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_230;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_218;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_200;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1e8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1d0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1b8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1a0;
  Mode local_188 [38];
  string local_f0;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  allocator<char> local_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  allocator_type local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  allocator_type local_b8;
  allocator<char> local_b7;
  allocator<char> local_b6;
  allocator<char> local_b5;
  allocator_type local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  allocator_type local_b0;
  allocator<char> local_af;
  allocator<char> local_ae;
  allocator<char> local_ad;
  allocator_type local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  allocator_type local_a8;
  allocator<char> local_a7;
  allocator<char> local_a6;
  allocator<char> local_a5;
  allocator_type local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  allocator_type local_a0;
  allocator<char> local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d;
  allocator_type local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  allocator_type local_98;
  allocator<char> local_97;
  allocator<char> local_96;
  allocator<char> local_95;
  allocator_type local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  allocator_type local_90;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator_type local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator_type local_88;
  allocator<char> local_87;
  allocator<char> local_86;
  allocator<char> local_85;
  allocator_type local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator_type local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator_type local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator_type local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator_type local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator_type local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator_type local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator_type local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator_type local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator_type local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string WasmSplitOption;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"wasm-split",(allocator<char> *)&local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "Split a module into a primary module and a secondary module, or instrument a module to gather a profile that can inform future splitting, or manage such profiles. Options that are only accepted in particular modes are marked with the accepted \"[<modes>]\" in their descriptions."
             ,(allocator<char> *)&local_3e8);
  ToolOptions::ToolOptions(&this->super_ToolOptions,(string *)local_58,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_58);
  (this->super_ToolOptions)._vptr_ToolOptions = (_func_int **)&PTR_addPassArg_00135c70;
  this->mode = Split;
  this->storageKind = InGlobals;
  this->usePlaceholders = true;
  this->unescape = false;
  this->verbose = false;
  this->emitBinary = true;
  this->symbolMap = false;
  this->placeholderMap = false;
  this->jspi = false;
  this->emitModuleNames = false;
  (this->profileFile)._M_dataplus._M_p = (pointer)&(this->profileFile).field_2;
  (this->profileFile)._M_string_length = 0;
  (this->profileFile).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&this->profileExport,(string *)DEFAULT_PROFILE_EXPORT_abi_cxx11_);
  p_Var1 = &(this->keepFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->splitFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->hasKeepFuncs = false;
  this->hasSplitFuncs = false;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  (this->primaryOutput)._M_dataplus._M_p = (pointer)&(this->primaryOutput).field_2;
  (this->primaryOutput)._M_string_length = 0;
  (this->primaryOutput).field_2._M_local_buf[0] = '\0';
  (this->secondaryOutput)._M_dataplus._M_p = (pointer)&(this->secondaryOutput).field_2;
  (this->secondaryOutput)._M_string_length = 0;
  (this->secondaryOutput).field_2._M_local_buf[0] = '\0';
  (this->importNamespace)._M_dataplus._M_p = (pointer)&(this->importNamespace).field_2;
  (this->importNamespace)._M_string_length = 0;
  (this->importNamespace).field_2._M_local_buf[0] = '\0';
  (this->placeholderNamespace)._M_dataplus._M_p = (pointer)&(this->placeholderNamespace).field_2;
  (this->placeholderNamespace)._M_string_length = 0;
  (this->placeholderNamespace).field_2._M_local_buf[0] = '\0';
  (this->secondaryMemoryName)._M_dataplus._M_p = (pointer)&(this->secondaryMemoryName).field_2;
  (this->secondaryMemoryName)._M_string_length = 0;
  (this->secondaryMemoryName).field_2._M_local_buf[0] = '\0';
  (this->exportPrefix)._M_dataplus._M_p = (pointer)&(this->exportPrefix).field_2;
  (this->exportPrefix)._M_string_length = 0;
  (this->exportPrefix).field_2._M_local_buf[0] = '\0';
  (this->manifestFile)._M_dataplus._M_p = (pointer)&(this->manifestFile).field_2;
  (this->manifestFile)._M_string_length = 0;
  (this->manifestFile).field_2._M_local_buf[0] = '\0';
  (this->outPrefix)._M_dataplus._M_p = (pointer)&(this->outPrefix).field_2;
  (this->outPrefix)._M_string_length = 0;
  (this->outPrefix).field_2._M_local_buf[0] = '\0';
  this->initialTableSize = -1;
  std::
  array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_5UL>
  ::array(&this->validOptions);
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"wasm-split options",(allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"--split",&local_cb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"",&local_ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"Split an input module into two output modules. The default mode."
             ,&local_c9);
  local_1308._8_8_ = 0;
  local_12f0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:97:10)>
               ::_M_invoke;
  local_12f8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:97:10)>
               ::_M_manager;
  local_1308._M_unused._M_object = this;
  add(this,&local_f0,&local_408,&local_3e8,(string *)local_58,Zero,(Action *)&local_1308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f08,"--multi-split",&local_c8)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee8,"",&local_c7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec8,
             "Split an input module into an arbitrary number of output modules.",&local_c6);
  local_12e8._8_8_ = 0;
  local_12d0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:104:7)>
               ::_M_invoke;
  local_12d8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:104:7)>
               ::_M_manager;
  local_12e8._M_unused._M_object = this;
  add(this,&local_f08,&local_ee8,&local_ec8,(string *)local_58,Zero,(Action *)&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ea8,"--instrument",&local_c5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e88,"",&local_c4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e68,
             "Instrument an input module to allow it to generate a profile that can be used to guide splitting."
             ,&local_c3);
  local_12c8._8_8_ = 0;
  local_12b0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:112:7)>
               ::_M_invoke;
  local_12b8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:112:7)>
               ::_M_manager;
  local_12c8._M_unused._M_object = this;
  add(this,&local_ea8,&local_e88,&local_e68,(string *)local_58,Zero,(Action *)&local_12c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e48,"--merge-profiles",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"",&local_c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e08,
             "Merge multiple profiles for the same module into a single profile.",&local_c0);
  local_12a8._8_8_ = 0;
  local_1290 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:118:10)>
               ::_M_invoke;
  local_1298 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:118:10)>
               ::_M_manager;
  local_12a8._M_unused._M_object = this;
  add(this,&local_e48,&local_e28,&local_e08,(string *)local_58,Zero,(Action *)&local_12a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_de8,"--print-profile",&local_bf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc8,"",&local_be);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da8,"Print profile contents in a human-readable format.",&local_bd);
  local_188[0] = PrintProfile;
  __l._M_len = 1;
  __l._M_array = local_188;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_3c8,__l,&local_bc);
  local_1288._8_8_ = 0;
  local_1270 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:127:10)>
               ::_M_invoke;
  local_1278 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:127:10)>
               ::_M_manager;
  local_1288._M_unused._M_object = this;
  add(this,&local_de8,&local_dc8,&local_da8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_3c8,One,(Action *)&local_1288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d88,"--profile",&local_bb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d48,"The profile to use to guide splitting.",&local_b9);
  local_188[1] = 0;
  __l_00._M_len = 1;
  __l_00._M_array = local_188 + 1;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_3b0,__l_00,&local_b8);
  local_1268._8_8_ = 0;
  local_1250 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:138:7)>
               ::_M_invoke;
  local_1258 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:138:7)>
               ::_M_manager;
  local_1268._M_unused._M_object = this;
  add(this,&local_d88,&local_d68,&local_d48,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_3b0,One,(Action *)&local_1268);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"--keep-funcs",&local_b7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"",&local_b6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ce8,
             "Comma-separated list of functions to keep in the primary module. The rest will be split out. Can be used alongside --profile and --split-funcs. You can also pass a file with one function per line by passing @filename."
             ,&local_b5);
  local_188[2] = 0;
  __l_01._M_len = 1;
  __l_01._M_array = local_188 + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_398,__l_01,&local_b4);
  local_1248._8_8_ = 0;
  local_1230 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:148:10)>
               ::_M_invoke;
  local_1238 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:148:10)>
               ::_M_manager;
  local_1248._M_unused._M_object = this;
  add(this,&local_d28,&local_d08,&local_ce8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_398,One,(Action *)&local_1248);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc8,"--split-funcs",&local_b3)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca8,"",&local_b2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c88,
             "Comma-separated list of functions to split out to the secondary module. The rest will be kept. Can be used alongside --profile and --keep-funcs. This takes precedence over other split options. You can also pass a file with one function per line by passing @filename."
             ,&local_b1);
  local_188[3] = 0;
  __l_02._M_len = 1;
  __l_02._M_array = local_188 + 3;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_380,__l_02,&local_b0);
  local_1228._8_8_ = 0;
  local_1210 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:162:10)>
               ::_M_invoke;
  local_1218 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:162:10)>
               ::_M_manager;
  local_1228._M_unused._M_object = this;
  add(this,&local_cc8,&local_ca8,&local_c88,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_380,One,(Action *)&local_1228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c68,"--manifest",&local_af);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"",&local_ae);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c28,
             "File describing the functions to be split into each module. Each section separated by a blank line begins with the base name of an output module, which is followed by a list of functions to place in that module, one per line."
             ,&local_ad);
  local_188[4] = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_188 + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_368,__l_03,&local_ac);
  local_1208._8_8_ = 0;
  local_11f0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:176:7)>
               ::_M_invoke;
  local_11f8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:176:7)>
               ::_M_manager;
  local_1208._M_unused._M_object = this;
  add(this,&local_c68,&local_c48,&local_c28,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_368,One,(Action *)&local_1208);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c08,"--out-prefix",&local_ab);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_be8,"",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,
             "Prefix prepended to module names in the manifest file to create output file names.",
             &local_a9);
  local_188[5] = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_188 + 5;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_350,__l_04,&local_a8);
  local_11e8._8_8_ = 0;
  local_11d0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:184:10)>
               ::_M_invoke;
  local_11d8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:184:10)>
               ::_M_manager;
  local_11e8._M_unused._M_object = this;
  add(this,&local_c08,&local_be8,&local_bc8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_350,One,(Action *)&local_11e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,"--primary-output",&local_a7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b88,"-o1",&local_a6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b68,"Output file for the primary module.",&local_a5);
  local_188[6] = 0;
  __l_05._M_len = 1;
  __l_05._M_array = local_188 + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_338,__l_05,&local_a4);
  local_11c8._8_8_ = 0;
  local_11b0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:191:10)>
               ::_M_invoke;
  local_11b8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:191:10)>
               ::_M_manager;
  local_11c8._M_unused._M_object = this;
  add(this,&local_ba8,&local_b88,&local_b68,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_338,One,(Action *)&local_11c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b48,"--secondary-output",&local_a3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,"-o2",&local_a2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"Output file for the secondary module.",&local_a1);
  local_188[7] = 0;
  __l_06._M_len = 1;
  __l_06._M_array = local_188 + 7;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_320,__l_06,&local_a0);
  local_11a8._8_8_ = 0;
  local_1190 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:200:10)>
               ::_M_invoke;
  local_1198 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:200:10)>
               ::_M_manager;
  local_11a8._M_unused._M_object = this;
  add(this,&local_b48,&local_b28,&local_b08,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_320,One,(Action *)&local_11a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"--symbolmap",&local_9f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"",&local_9e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_aa8,"Write a symbol map file for each of the output modules.",
             &local_9d);
  local_188[8] = 0;
  __l_07._M_len = 1;
  __l_07._M_array = local_188 + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_308,__l_07,&local_9c);
  local_1188._8_8_ = 0;
  local_1170 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:209:10)>
               ::_M_invoke;
  local_1178 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:209:10)>
               ::_M_manager;
  local_1188._M_unused._M_object = this;
  add(this,&local_ae8,&local_ac8,&local_aa8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_308,Zero,(Action *)&local_1188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,"--no-placeholders",&local_9b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a68,"",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,
             "Do not import placeholder functions. Calls to secondary functions will fail before the secondary module has been instantiated."
             ,&local_99);
  local_188[9] = 0;
  __l_08._M_len = 1;
  __l_08._M_array = local_188 + 9;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2f0,__l_08,&local_98);
  local_1168._8_8_ = 0;
  local_1150 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:218:7)>
               ::_M_invoke;
  local_1158 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:218:7)>
               ::_M_manager;
  local_1168._M_unused._M_object = this;
  add(this,&local_a88,&local_a68,&local_a48,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2f0,Zero,(Action *)&local_1168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a28,"--placeholdermap",&local_97);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"",&local_96);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e8,"Write a file mapping placeholder indices to the function names.",
             &local_95);
  local_188[10] = 0;
  __l_09._M_len = 1;
  __l_09._M_array = local_188 + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2d8,__l_09,&local_94);
  local_1148._8_8_ = 0;
  local_1130 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:226:7)>
               ::_M_invoke;
  local_1138 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:226:7)>
               ::_M_manager;
  local_1148._M_unused._M_object = this;
  add(this,&local_a28,&local_a08,&local_9e8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2d8,Zero,(Action *)&local_1148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"--import-namespace",&local_93);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_988,
             "When provided as an option for module splitting, the namespace from which to import objects from the primary module into the secondary module. In instrument mode, refers to the namespace from which to import the secondary memory, if any."
             ,&local_91);
  local_f28[0] = Split;
  local_f28[1] = Instrument;
  __l_10._M_len = 2;
  __l_10._M_array = local_f28;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2c0,__l_10,&local_90);
  local_1128._8_8_ = 0;
  local_1110 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:236:10)>
               ::_M_invoke;
  local_1118 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:236:10)>
               ::_M_manager;
  local_1128._M_unused._M_object = this;
  add(this,&local_9c8,&local_9a8,&local_988,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2c0,One,(Action *)&local_1128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"--placeholder-namespace",&local_8f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"",&local_8e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,
             "The namespace from which to import placeholder functions into the primary module.",
             &local_8d);
  local_188[0xb] = 0;
  __l_11._M_len = 1;
  __l_11._M_array = local_188 + 0xb;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2a8,__l_11,&local_8c);
  local_1108._8_8_ = 0;
  local_10f0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:246:10)>
               ::_M_invoke;
  local_10f8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:246:10)>
               ::_M_manager;
  local_1108._M_unused._M_object = this;
  add(this,&local_968,&local_948,&local_928,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2a8,One,(Action *)&local_1108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"--jspi",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,
             "Transform the module to support asynchronously loading the secondary module before any placeholder functions have been called."
             ,&local_89);
  local_188[0xc] = 0;
  __l_12._M_len = 1;
  __l_12._M_array = local_188 + 0xc;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_290,__l_12,&local_88);
  local_10e8._8_8_ = 0;
  local_10d0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:256:10)>
               ::_M_invoke;
  local_10d8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:256:10)>
               ::_M_manager;
  local_10e8._M_unused._M_object = this;
  add(this,&local_908,&local_8e8,&local_8c8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_290,Zero,(Action *)&local_10e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"--export-prefix",&local_87);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"",&local_86);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,
             "An identifying prefix to prepend to new export names created by module splitting.",
             &local_85);
  local_188[0xd] = 0;
  __l_13._M_len = 1;
  __l_13._M_array = local_188 + 0xd;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_278,__l_13,&local_84);
  local_10c8._8_8_ = 0;
  local_10b0 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:265:7)>
               ::_M_invoke;
  local_10b8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:265:7)>
               ::_M_manager;
  local_10c8._M_unused._M_object = this;
  add(this,&local_8a8,&local_888,&local_868,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_278,One,(Action *)&local_10c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,"--profile-export",&local_83);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"",&local_82);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,
             "The export name of the function the embedder calls to write the profile into memory. Defaults to `__write_profile`."
             ,&local_81);
  local_188[0xe] = 2;
  __l_14._M_len = 1;
  __l_14._M_array = local_188 + 0xe;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_260,__l_14,&local_80);
  local_10a8._8_8_ = 0;
  local_1090 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:273:10)>
               ::_M_invoke;
  local_1098 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:273:10)>
               ::_M_manager;
  local_10a8._M_unused._M_object = this;
  add(this,&local_848,&local_828,&local_808,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_260,One,(Action *)&local_10a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"--in-memory",&local_7f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"",&local_7e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,
             "Store profile information in memory (starting at address 0 and taking one byte per function) rather than globals (the default) so that it can be shared between multiple threads. Users are responsible for ensuring that the module does not use the initial memory region for anything else."
             ,&local_7d);
  local_188[0xf] = 2;
  __l_15._M_len = 1;
  __l_15._M_array = local_188 + 0xf;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_248,__l_15,&local_7c);
  local_1088._8_8_ = 0;
  local_1070 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:287:7)>
               ::_M_invoke;
  local_1078 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:287:7)>
               ::_M_manager;
  local_1088._M_unused._M_object = this;
  add(this,&local_7e8,&local_7c8,&local_7a8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_248,Zero,(Action *)&local_1088);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"--in-secondary-memory",&local_7b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,
             "Store profile information in a separate memory, rather than in module main memory or globals (the default). With this option, users do not need to reserve the initial memory region for profile data and the data can be shared between multiple threads."
             ,&local_79);
  local_188[0x10] = 2;
  __l_16._M_len = 1;
  __l_16._M_array = local_188 + 0x10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_230,__l_16,&local_78);
  local_1068._8_8_ = 0;
  local_1050 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:300:7)>
               ::_M_invoke;
  local_1058 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:300:7)>
               ::_M_manager;
  local_1068._M_unused._M_object = this;
  add(this,&local_788,&local_768,&local_748,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_230,Zero,(Action *)&local_1068);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"--secondary-memory-name",&local_77);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"",&local_76);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,
             "The name of the secondary memory created to store profile information.",&local_75);
  local_188[0x11] = 2;
  __l_17._M_len = 1;
  __l_17._M_array = local_188 + 0x11;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_218,__l_17,&local_74);
  local_1048._8_8_ = 0;
  local_1030 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:310:10)>
               ::_M_invoke;
  local_1038 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:310:10)>
               ::_M_manager;
  local_1048._M_unused._M_object = this;
  add(this,&local_728,&local_708,&local_6e8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_218,One,(Action *)&local_1048);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"--emit-module-names",&local_73);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,
             "Emit module names, even if not emitting the rest of the names section. Can help differentiate the modules in stack traces. This option will be removed once simpler ways of naming modules are widely available. See https://bugs.chromium.org/p/v8/issues/detail?id=11808."
             ,&local_71);
  local_f28[2] = Split;
  local_f28[3] = Instrument;
  __l_18._M_len = 2;
  __l_18._M_array = local_f28 + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_200,__l_18,&local_70);
  local_1028._8_8_ = 0;
  local_1010 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:323:7)>
               ::_M_invoke;
  local_1018 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:323:7)>
               ::_M_manager;
  local_1028._M_unused._M_object = this;
  add(this,&local_6c8,&local_6a8,&local_688,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_200,Zero,(Action *)&local_1028);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"--initial-table",&local_6f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"",&local_6e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,
             "A hack to ensure the split and instrumented modules have the same table size when using Emscripten\'s SPLIT_MODULE mode with dynamic linking. TODO: Figure out a more elegant solution for that use case and remove this."
             ,&local_6d);
  local_f28[4] = Split;
  local_f28[5] = Instrument;
  __l_19._M_len = 2;
  __l_19._M_array = local_f28 + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1e8,__l_19,&local_6c);
  local_1008._8_8_ = 0;
  local_ff0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:333:10)>
              ::_M_invoke;
  local_ff8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:333:10)>
              ::_M_manager;
  local_1008._M_unused._M_object = this;
  add(this,&local_668,&local_648,&local_628,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1e8,One,(Action *)&local_1008);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"--emit-text",&local_6b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"-S",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"Emit text instead of binary for the output file or files.",
             &local_69);
  local_f28[6] = Split;
  local_f28[7] = Instrument;
  __l_20._M_len = 2;
  __l_20._M_array = local_f28 + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1d0,__l_20,&local_68);
  local_fe8._8_8_ = 0;
  local_fd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:342:10)>
              ::_M_invoke;
  local_fd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:342:10)>
              ::_M_manager;
  local_fe8._M_unused._M_object = this;
  add(this,&local_608,&local_5e8,&local_5c8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1d0,Zero,(Action *)&local_fe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"--debuginfo",&local_67);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"-g",&local_66);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"Emit names section in wasm binary (or full debuginfo in wast)",
             &local_65);
  local_1320[0] = Split;
  local_1320[1] = MultiSplit;
  local_1320[2] = 2;
  __l_21._M_len = 3;
  __l_21._M_array = local_1320;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1b8,__l_21,&local_64);
  local_fc8._8_8_ = 0;
  local_fb0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:349:10)>
              ::_M_invoke;
  local_fb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:349:10)>
              ::_M_manager;
  local_fc8._M_unused._M_object = this;
  add(this,&local_5a8,&local_588,&local_568,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1b8,Zero,(Action *)&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"--output",&local_63);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"-o",&local_62);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"Output file.",&local_61);
  local_1320[3] = Instrument;
  local_1320[4] = MergeProfiles;
  local_1320[5] = 1;
  __l_22._M_len = 3;
  __l_22._M_array = local_1320 + 3;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1a0,__l_22,&local_60);
  local_fa8._8_8_ = 0;
  local_f90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:358:10)>
              ::_M_invoke;
  local_f98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:358:10)>
              ::_M_manager;
  local_fa8._M_unused._M_object = this;
  add(this,&local_548,&local_528,&local_508,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1a0,One,(Action *)&local_fa8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"--unescape",&local_5f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"-u",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"Un-escape function names (in print-profile output)",&local_5d);
  local_f88._8_8_ = 0;
  local_f70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:364:10)>
              ::_M_invoke;
  local_f78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:364:10)>
              ::_M_manager;
  local_f88._M_unused._M_object = this;
  add(this,&local_4e8,&local_4c8,&local_4a8,(string *)local_58,Zero,(Action *)&local_f88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"--verbose",&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"-v",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,
             "Verbose output mode. Prints the functions that will be kept and split out when splitting a module."
             ,&local_5a);
  local_f68._8_8_ = 0;
  local_f50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:371:10)>
              ::_M_invoke;
  local_f58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:371:10)>
              ::_M_manager;
  local_f68._M_unused._M_object = this;
  add(this,&local_488,&local_468,&local_448,(string *)local_58,Zero,(Action *)&local_f68);
  std::__cxx11::string::string<std::allocator<char>>(local_428,"INFILES",&local_59);
  local_f48._8_8_ = 0;
  local_f30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:377:21)>
              ::_M_invoke;
  local_f38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:377:21)>
              ::_M_manager;
  local_f48._M_unused._M_object = this;
  wasm::Options::add_positional
            ((string *)&(this->super_ToolOptions).super_Options,(Arguments)local_428,(function *)0x2
            );
  std::_Function_base::~_Function_base((_Function_base *)&local_f48);
  std::__cxx11::string::~string(local_428);
  std::_Function_base::~_Function_base((_Function_base *)&local_f68);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::_Function_base::~_Function_base((_Function_base *)&local_f88);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_fa8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1a0);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::_Function_base::~_Function_base((_Function_base *)&local_fc8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1b8);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_fe8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1d0);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_608);
  std::_Function_base::~_Function_base((_Function_base *)&local_1008);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1e8);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_1028);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_200);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_218);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_728);
  std::_Function_base::~_Function_base((_Function_base *)&local_1068);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_230);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_788);
  std::_Function_base::~_Function_base((_Function_base *)&local_1088);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_248);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_10a8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_260);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_848);
  std::_Function_base::~_Function_base((_Function_base *)&local_10c8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_278);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_10e8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_290);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::_Function_base::~_Function_base((_Function_base *)&local_1108);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2a8);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_968);
  std::_Function_base::~_Function_base((_Function_base *)&local_1128);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2c0);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1148);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2d8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_a28);
  std::_Function_base::~_Function_base((_Function_base *)&local_1168);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2f0);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a88);
  std::_Function_base::~_Function_base((_Function_base *)&local_1188);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_308);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::_Function_base::~_Function_base((_Function_base *)&local_11a8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_320);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_b48);
  std::_Function_base::~_Function_base((_Function_base *)&local_11c8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_338);
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::_Function_base::~_Function_base((_Function_base *)&local_11e8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_350);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_c08);
  std::_Function_base::~_Function_base((_Function_base *)&local_1208);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_368);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_c68);
  std::_Function_base::~_Function_base((_Function_base *)&local_1228);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_380);
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1248);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_398);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_d28);
  std::_Function_base::~_Function_base((_Function_base *)&local_1268);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_3b0);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_d88);
  std::_Function_base::~_Function_base((_Function_base *)&local_1288);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_3c8);
  std::__cxx11::string::~string((string *)&local_da8);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_de8);
  std::_Function_base::~_Function_base((_Function_base *)&local_12a8);
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_e48);
  std::_Function_base::~_Function_base((_Function_base *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string((string *)&local_e88);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::_Function_base::~_Function_base((_Function_base *)&local_12e8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string((string *)&local_f08);
  std::_Function_base::~_Function_base((_Function_base *)&local_1308);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

WasmSplitOptions::WasmSplitOptions()
  : ToolOptions("wasm-split",
                "Split a module into a primary module and a secondary "
                "module, or instrument a module to gather a profile that "
                "can inform future splitting, or manage such profiles. Options "
                "that are only accepted in particular modes are marked with "
                "the accepted \"[<modes>]\" in their descriptions.") {
  const std::string WasmSplitOption = "wasm-split options";

  (*this)
    .add("--split",
         "",
         "Split an input module into two output modules. The default mode.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { mode = Mode::Split; })
    .add(
      "--multi-split",
      "",
      "Split an input module into an arbitrary number of output modules.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::MultiSplit; })
    .add(
      "--instrument",
      "",
      "Instrument an input module to allow it to generate a profile that can"
      " be used to guide splitting.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::Instrument; })
    .add("--merge-profiles",
         "",
         "Merge multiple profiles for the same module into a single profile.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           mode = Mode::MergeProfiles;
         })
    .add("--print-profile",
         "",
         "Print profile contents in a human-readable format.",
         WasmSplitOption,
         {Mode::PrintProfile},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           mode = Mode::PrintProfile;
           profileFile = argument;
         })
    .add(
      "--profile",
      "",
      "The profile to use to guide splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { profileFile = argument; })
    .add("--keep-funcs",
         "",
         "Comma-separated list of functions to keep in the primary module. The "
         "rest will be split out. Can be used alongside --profile and "
         "--split-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           keepFuncs = parseNameList(argument);
           hasKeepFuncs = true;
         })
    .add("--split-funcs",
         "",
         "Comma-separated list of functions to split out to the secondary "
         "module. The rest will be kept. Can be used alongside --profile and "
         "--keep-funcs. This takes precedence over other split options. "
         "You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           splitFuncs = parseNameList(argument);
           hasSplitFuncs = true;
         })
    .add(
      "--manifest",
      "",
      "File describing the functions to be split into each module. Each "
      "section separated by a blank line begins with the base name of an "
      "output module, which is followed by a list of functions to place in "
      "that module, one per line.",
      WasmSplitOption,
      {Mode::MultiSplit},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { manifestFile = argument; })
    .add("--out-prefix",
         "",
         "Prefix prepended to module names in the manifest file to create "
         "output file names.",
         WasmSplitOption,
         {Mode::MultiSplit},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { outPrefix = argument; })
    .add("--primary-output",
         "-o1",
         "Output file for the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           primaryOutput = argument;
         })
    .add("--secondary-output",
         "-o2",
         "Output file for the secondary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryOutput = argument;
         })
    .add("--symbolmap",
         "",
         "Write a symbol map file for each of the output modules.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { symbolMap = true; })
    .add(
      "--no-placeholders",
      "",
      "Do not import placeholder functions. Calls to secondary functions will "
      "fail before the secondary module has been instantiated.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { usePlaceholders = false; })
    .add(
      "--placeholdermap",
      "",
      "Write a file mapping placeholder indices to the function names.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { placeholderMap = true; })
    .add("--import-namespace",
         "",
         "When provided as an option for module splitting, the namespace from "
         "which to import objects from the primary "
         "module into the secondary module. In instrument mode, refers to the "
         "namespace from which to import the secondary memory, if any.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           importNamespace = argument;
         })
    .add("--placeholder-namespace",
         "",
         "The namespace from which to import placeholder functions into "
         "the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           placeholderNamespace = argument;
         })
    .add("--jspi",
         "",
         "Transform the module to support asynchronously loading the secondary "
         "module before any placeholder functions have been called.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { jspi = true; })
    .add(
      "--export-prefix",
      "",
      "An identifying prefix to prepend to new export names created "
      "by module splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { exportPrefix = argument; })
    .add("--profile-export",
         "",
         "The export name of the function the embedder calls to write the "
         "profile into memory. Defaults to `__write_profile`.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           profileExport = argument;
         })
    .add(
      "--in-memory",
      "",
      "Store profile information in memory (starting at address 0 and taking "
      "one byte per function) rather than globals (the default) so that "
      "it can be shared between multiple threads. Users are responsible for "
      "ensuring that the module does not use the initial memory region for "
      "anything else.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InMemory;
      })
    .add(
      "--in-secondary-memory",
      "",
      "Store profile information in a separate memory, rather than in module "
      "main memory or globals (the default). With this option, users do not "
      "need to reserve the initial memory region for profile data and the "
      "data can be shared between multiple threads.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InSecondaryMemory;
      })
    .add("--secondary-memory-name",
         "",
         "The name of the secondary memory created to store profile "
         "information.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryMemoryName = argument;
         })
    .add(
      "--emit-module-names",
      "",
      "Emit module names, even if not emitting the rest of the names section. "
      "Can help differentiate the modules in stack traces. This option will be "
      "removed once simpler ways of naming modules are widely available. See "
      "https://bugs.chromium.org/p/v8/issues/detail?id=11808.",
      WasmSplitOption,
      {Mode::Split, Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& arguments) { emitModuleNames = true; })
    .add("--initial-table",
         "",
         "A hack to ensure the split and instrumented modules have the same "
         "table size when using Emscripten's SPLIT_MODULE mode with dynamic "
         "linking. TODO: Figure out a more elegant solution for that use "
         "case and remove this.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           initialTableSize = std::stoi(argument);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file or files.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmSplitOption,
         {Mode::Split, Mode::MultiSplit, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) {
           passOptions.debugInfo = true;
         })
    .add("--output",
         "-o",
         "Output file.",
         WasmSplitOption,
         {Mode::Instrument, Mode::MergeProfiles, Mode::MultiSplit},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { output = argument; })
    .add("--unescape",
         "-u",
         "Un-escape function names (in print-profile output)",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { unescape = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode. Prints the functions that will be kept "
         "and split out when splitting a module.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           verbose = true;
           quiet = false;
         })
    .add_positional("INFILES",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      inputFiles.push_back(argument);
                    });
}